

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netmessagemaker.h
# Opt level: O1

CSerializedNetMsg * __thiscall
NetMsg::
Make<int_const&,unsigned_long&,long_const&,unsigned_long&,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long&,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long&,std::__cxx11::string&,int_const&,bool_const&>
          (CSerializedNetMsg *__return_storage_ptr__,NetMsg *this,string msg_type,int *args,
          unsigned_long *args_1,long *args_2,unsigned_long *args_3,
          ParamsWrapper<CNetAddr::SerParams,_CService> *args_4,unsigned_long *args_5,
          ParamsWrapper<CNetAddr::SerParams,_CService> *args_6,unsigned_long *args_7,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_8,int *args_9,
          bool *args_10)

{
  long in_FS_OFFSET;
  VectorWriter local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_type)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_type).field_2;
  (__return_storage_ptr__->m_type)._M_string_length = 0;
  (__return_storage_ptr__->m_type).field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&__return_storage_ptr__->m_type,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  VectorWriter::
  VectorWriter<int_const&,unsigned_long&,long_const&,unsigned_long&,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long&,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long&,std::__cxx11::string&,int_const&,bool_const&>
            (&local_48,&__return_storage_ptr__->data,0,args,args_1,args_2,args_3,
             (ParamsWrapper<CNetAddr::SerParams,_CService> *)msg_type._M_dataplus._M_p,
             (unsigned_long *)msg_type._M_string_length,
             (ParamsWrapper<CNetAddr::SerParams,_CService> *)msg_type.field_2._M_allocated_capacity,
             (unsigned_long *)msg_type.field_2._8_8_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_4,
             (int *)args_5,(bool *)args_6);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CSerializedNetMsg Make(std::string msg_type, Args&&... args)
    {
        CSerializedNetMsg msg;
        msg.m_type = std::move(msg_type);
        VectorWriter{msg.data, 0, std::forward<Args>(args)...};
        return msg;
    }